

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUnits.c
# Opt level: O0

void guardAttack(UnitList *guardList,UnitList *inmateList)

{
  _Bool _Var1;
  UnitNode *pUVar2;
  undefined8 local_28;
  UnitNode *nextGuard;
  UnitNode *nextInmate;
  UnitList *inmateList_local;
  UnitList *guardList_local;
  
  local_28 = getHead(guardList);
  nextGuard = getHead(inmateList);
  do {
    do {
      _Var1 = inRange(nextGuard,local_28);
      if (_Var1) {
        dealDamage(nextGuard,local_28);
      }
      nextGuard = getNext(nextGuard);
      pUVar2 = getNext(nextGuard);
    } while (pUVar2 != (UnitNode *)0x0);
    local_28 = getNext(local_28);
    pUVar2 = getNext(local_28);
  } while (pUVar2 != (UnitNode *)0x0);
  return;
}

Assistant:

void guardAttack(struct UnitList *guardList, struct UnitList *inmateList) {
    struct UnitNode *nextInmate;
    struct UnitNode *nextGuard;

    nextGuard = getHead(guardList);
    nextInmate = getHead(inmateList);

    do {
        do {
            if (inRange(nextInmate, nextGuard))
                dealDamage(nextInmate, nextGuard);
            nextInmate = getNext(nextInmate);
        } while (getNext(nextInmate) != NULL);
        nextGuard = getNext(nextGuard);
    } while (getNext(nextGuard) != NULL);
}